

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_tls_policy::get(_tls_policy *this,service *srv)

{
  long lVar1;
  application *app;
  service *in_RDX;
  
  lVar1 = (**(code **)((long)((srv[3].impl_.ptr_)->io_service_)._M_t.
                             super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
                             .super__Head_base<0UL,_booster::aio::io_service_*,_false> + 0x10))();
  app = *(application **)(lVar1 + 8);
  lVar1 = (**(code **)((long)((srv[3].impl_.ptr_)->io_service_)._M_t.
                             super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
                             .super__Head_base<0UL,_booster::aio::io_service_*,_false> + 0x10))();
  *(undefined8 *)(lVar1 + 8) = 0;
  if (app == (application *)0x0) {
    app = get_new((application_specific_pool *)srv[2].impl_.ptr_,in_RDX);
    (this->super__policy)._vptr__policy = (_func_int **)app;
    if (app == (application *)0x0) {
      return (intrusive_ptr<cppcms::application>)(application *)this;
    }
  }
  else {
    (this->super__policy)._vptr__policy = (_func_int **)app;
  }
  booster::intrusive_ptr_add_ref(app);
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get(cppcms::service &srv)
	{
		application *app = tss_.release();
		if(!app)
			return get_new(srv);
		return app;
	}